

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

BlendFunc deqp::gles31::Functional::anon_unknown_0::getRandomBlendFunc(Random *rng)

{
  deUint32 dVar1;
  deUint32 dVar2;
  uint *puVar3;
  deUint32 dst;
  deUint32 src;
  deUint32 funcs [15];
  Random *rng_local;
  
  unique0x100000be = rng;
  memcpy(&dst,&DAT_00f743b0,0x3c);
  dVar1 = de::Random::getUint32(stack0xffffffffffffffe8);
  puVar3 = de::getSizedArrayElement<15,15,unsigned_int>((uint (*) [15])&dst,dVar1 % 0xf);
  dVar1 = *puVar3;
  dVar2 = de::Random::getUint32(stack0xffffffffffffffe8);
  puVar3 = de::getSizedArrayElement<15,15,unsigned_int>((uint (*) [15])&dst,dVar2 % 0xf);
  BlendFunc::BlendFunc((BlendFunc *)&rng_local,dVar1,*puVar3);
  return (BlendFunc)rng_local;
}

Assistant:

BlendFunc getRandomBlendFunc (de::Random& rng)
{
	const deUint32 funcs[] =
	{
		GL_ZERO,
		GL_ONE,
		GL_SRC_COLOR,
		GL_ONE_MINUS_SRC_COLOR,
		GL_DST_COLOR,
		GL_ONE_MINUS_DST_COLOR,
		GL_SRC_ALPHA,
		GL_ONE_MINUS_SRC_ALPHA,
		GL_DST_ALPHA,
		GL_ONE_MINUS_DST_ALPHA,
		GL_CONSTANT_COLOR,
		GL_ONE_MINUS_CONSTANT_COLOR,
		GL_CONSTANT_ALPHA,
		GL_ONE_MINUS_CONSTANT_ALPHA,
		GL_SRC_ALPHA_SATURATE
	};

	const deUint32 src = de::getSizedArrayElement<DE_LENGTH_OF_ARRAY(funcs)>(funcs, rng.getUint32() % DE_LENGTH_OF_ARRAY(funcs));
	const deUint32 dst = de::getSizedArrayElement<DE_LENGTH_OF_ARRAY(funcs)>(funcs, rng.getUint32() % DE_LENGTH_OF_ARRAY(funcs));

	return BlendFunc(src, dst);
}